

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeMaxObj(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *newVal,bool scale)

{
  long *plVar1;
  byte in_CL;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff20;
  undefined1 local_bc [56];
  undefined1 local_84 [59];
  byte local_49;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_49 = in_CL & 1;
  if (local_49 == 0) {
    local_8 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::maxObj_w(in_RDX,in_stack_ffffffffffffff1c);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_RDX,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  else {
    plVar1 = *(long **)(in_RDI + 0x1d0);
    local_28 = local_bc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff20,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    (**(code **)(*plVar1 + 0x148))(local_84,plVar1,in_RDI,in_ESI,local_bc);
    local_18 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::maxObj_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_20 = local_84;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff20,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  return;
}

Assistant:

virtual void changeMaxObj(int i, const R& newVal, bool scale = false)
   {
      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::maxObj_w(i) = lp_scaler->scaleObj(*this, i, newVal);
      }
      else
         LPColSetBase<R>::maxObj_w(i) = newVal;

      assert(isConsistent());
   }